

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O2

bool __thiscall libDAI::NDP::initProps(NDP *this)

{
  Properties *this_00;
  bool bVar1;
  unsigned_long uVar2;
  allocator<char> local_39;
  PropertyKey local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"verbose",&local_39);
  this_00 = &(this->super_DAIAlgFG).super_InferenceAlgorithm._properties;
  bVar1 = Properties::hasKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"verbose",&local_39);
    uVar2 = Properties::FromStringTo<unsigned_long>(this_00,&local_38);
    (this->Props).verbose = uVar2;
    std::__cxx11::string::~string((string *)&local_38);
  }
  return bVar1;
}

Assistant:

bool NDP::initProps() {
        //if( !HasProperty("updates") )
            //return false;
        //if( !HasProperty("tol") )
            //return false;
        //if( !HasProperty("maxiter") )
            //return false;
        if( !HasProperty("verbose") )
            return false;
        
        //Props.updates = FromStringTo<UpdateType>("updates");
        //Props.tol     = FromStringTo<double>("tol");
        //Props.maxiter = FromStringTo<size_t>("maxiter");
        Props.verbose = FromStringTo<size_t>("verbose");
        //if( HasProperty("damping") )
            //Props.damping = FromStringTo<double>("damping");
        //else
            //Props.damping = 0.0;

        return true;
    }